

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall tetgenmesh::checkregular(tetgenmesh *this,int type)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  point pb;
  point pa;
  point pc;
  point pd;
  point pe;
  char *pcVar6;
  char *pcVar7;
  uint local_88;
  int local_84;
  int horrors;
  int ndcount;
  double sign;
  point p [5];
  undefined1 local_48 [8];
  face checksh;
  triface symtet;
  triface tetloop;
  int type_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&symtet.ver);
  triface::triface((triface *)&checksh.shver);
  face::face((face *)local_48);
  if (this->b->quiet == 0) {
    pcVar7 = "regular";
    if ((type & 2U) == 0) {
      pcVar7 = "Delaunay";
    }
    pcVar6 = "(s)";
    if ((type & 1U) == 0) {
      pcVar6 = " ";
    }
    printf("  Checking %s %s property of the mesh...\n",pcVar7,pcVar6);
  }
  local_84 = 0;
  local_88 = 0;
  memorypool::traversalinit(this->tetrahedrons);
  symtet._8_8_ = tetrahedrontraverse(this);
  while (symtet._8_8_ != 0) {
    for (tetloop.tet._0_4_ = 0; (int)tetloop.tet < 4; tetloop.tet._0_4_ = (int)tetloop.tet + 1) {
      fsym(this,(triface *)&symtet.ver,(triface *)&checksh.shver);
      if ((*(point *)(checksh._8_8_ + 0x38) != this->dummypoint) &&
         ((ulong)symtet._8_8_ < (ulong)checksh._8_8_)) {
        pb = org(this,(triface *)&symtet.ver);
        pa = dest(this,(triface *)&symtet.ver);
        pc = apex(this,(triface *)&symtet.ver);
        pd = oppo(this,(triface *)&symtet.ver);
        pe = oppo(this,(triface *)&checksh.shver);
        if (type == 0) {
          _horrors = insphere(pa,pb,pc,pd,pe);
        }
        else if (type == 1) {
          _horrors = insphere_s(this,pa,pb,pc,pd,pe);
        }
        else if (type == 2) {
          _horrors = orient4d(pa,pb,pc,pd,pe,pa[3],pb[3],pc[3],pd[3],pe[3]);
        }
        else {
          _horrors = orient4d_s(this,pa,pb,pc,pd,pe,pa[3],pb[3],pc[3],pd[3],pe[3]);
        }
        if (0.0 < _horrors) {
          local_84 = local_84 + 1;
          if (this->checksubfaceflag != 0) {
            tspivot(this,(triface *)&symtet.ver,(face *)local_48);
          }
          if (local_48 == (undefined1  [8])0x0) {
            pcVar7 = "regular";
            if ((type & 2U) == 0) {
              pcVar7 = "Delaunay";
            }
            uVar1 = pointmark(this,pb);
            uVar2 = pointmark(this,pa);
            uVar3 = pointmark(this,pc);
            uVar4 = pointmark(this,pd);
            iVar5 = pointmark(this,pe);
            printf("  !! Non-locally %s (%d, %d, %d) - %d, %d\n",pcVar7,(ulong)uVar1,(ulong)uVar2,
                   (ulong)uVar3,(ulong)uVar4,iVar5);
            local_88 = local_88 + 1;
          }
        }
      }
    }
    symtet._8_8_ = tetrahedrontraverse(this);
  }
  if (local_88 == 0) {
    if (this->b->quiet == 0) {
      if (local_84 < 1) {
        pcVar7 = "regular";
        if ((type & 2U) == 0) {
          pcVar7 = "Delaunay";
        }
        printf("  The mesh is %s.\n",pcVar7);
      }
      else {
        pcVar7 = "regular";
        if ((type & 2U) == 0) {
          pcVar7 = "Delaunay";
        }
        printf("  The mesh is constrained %s.\n",pcVar7);
      }
    }
  }
  else {
    pcVar7 = "regular";
    if ((type & 2U) == 0) {
      pcVar7 = "Delaunay";
    }
    printf("  !! !! !! !! Found %d non-%s faces.\n",(ulong)local_88,pcVar7);
  }
  return local_88;
}

Assistant:

int tetgenmesh::checkregular(int type)
{
  triface tetloop;
  triface symtet;
  face checksh;
  point p[5];
  REAL sign;
  int ndcount; // Count the non-locally Delaunay faces.
  int horrors;

  if (!b->quiet) {
    printf("  Checking %s %s property of the mesh...\n",
           (type & 2) == 0 ? "Delaunay" : "regular",
           (type & 1) == 0 ? " " : "(s)");
  }

  // Make sure orient3d(p[1], p[0], p[2], p[3]) > 0;
  //   Hence if (insphere(p[1], p[0], p[2], p[3], p[4]) > 0) means that
  //     p[4] lies inside the circumsphere of p[1], p[0], p[2], p[3].
  //   The same if orient4d(p[1], p[0], p[2], p[3], p[4]) > 0 means that
  //     p[4] lies below the oriented hyperplane passing through 
  //     p[1], p[0], p[2], p[3].

  ndcount = 0;
  horrors = 0;
  tetloop.ver = 0;
  // Run through the list of triangles, checking each one.
  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  while (tetloop.tet != (tetrahedron *) NULL) {
    // Check all four faces of the tetrahedron.
    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
      fsym(tetloop, symtet);
      // Only do test if its adjoining tet is not a hull tet or its pointer
      //   is larger (to ensure that each pair isn't tested twice).
      if (((point) symtet.tet[7] != dummypoint)&&(tetloop.tet < symtet.tet)) {
        p[0] = org(tetloop);   // pa
        p[1] = dest(tetloop);  // pb
        p[2] = apex(tetloop);  // pc
        p[3] = oppo(tetloop);  // pd
        p[4] = oppo(symtet);   // pe

        if (type == 0) {
          sign = insphere(p[1], p[0], p[2], p[3], p[4]);
        } else if (type == 1) {
          sign = insphere_s(p[1], p[0], p[2], p[3], p[4]);
        } else if (type == 2) {
          sign = orient4d(p[1],    p[0],    p[2],    p[3],    p[4], 
                          p[1][3], p[0][3], p[2][3], p[3][3], p[4][3]);
        } else { // type == 3
          sign = orient4d_s(p[1],    p[0],    p[2],    p[3],    p[4], 
                            p[1][3], p[0][3], p[2][3], p[3][3], p[4][3]);
        }

        if (sign > 0.0) {
          ndcount++;
          if (checksubfaceflag) {
            tspivot(tetloop, checksh);
          }
          if (checksh.sh == NULL) {
            printf("  !! Non-locally %s (%d, %d, %d) - %d, %d\n",
                   (type & 2) == 0 ? "Delaunay" : "regular",
		   pointmark(p[0]), pointmark(p[1]), pointmark(p[2]), 
                   pointmark(p[3]), pointmark(p[4]));
            horrors++;
          }
        }
      }
    }
    tetloop.tet = tetrahedrontraverse();
  }

  if (horrors == 0) {
    if (!b->quiet) {
      if (ndcount > 0) {
        printf("  The mesh is constrained %s.\n",
               (type & 2) == 0 ? "Delaunay" : "regular");
      } else {
        printf("  The mesh is %s.\n", (type & 2) == 0 ? "Delaunay" : "regular");
      } 
    }
  } else {
    printf("  !! !! !! !! Found %d non-%s faces.\n", horrors,
           (type & 2) == 0 ? "Delaunay" : "regular");
  }

  return horrors;
}